

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O2

void __thiscall Functional::turn(Functional *this,int id,double alpha)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double __x;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int i;
  long lVar8;
  long lVar9;
  Group g;
  Group k;
  _Vector_base<Point,_std::allocator<Point>_> local_60;
  Point local_48;
  
  std::vector<Point,_std::allocator<Point>_>::vector
            (&g.points,
             &(this->f).groups.super__Vector_base<Group,_std::allocator<Group>_>._M_impl.
              super__Vector_impl_data._M_start[id].points);
  k.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  k.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  k.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __x = (alpha * 3.14159265) / 180.0;
  lVar9 = 0;
  for (lVar8 = 0;
      lVar8 < (int)(((long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18); lVar8 = lVar8 + 1) {
    dVar1 = *(double *)
             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_start)->x + lVar9);
    dVar4 = cos(__x);
    dVar5 = sin(__x);
    dVar2 = *(double *)
             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_start)->y + lVar9);
    dVar3 = *(double *)
             ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                      super__Vector_impl_data._M_start)->x + lVar9);
    dVar6 = sin(__x);
    dVar7 = cos(__x);
    Point::Point(&local_48,dVar4 * dVar1 - dVar5 * dVar2,
                 dVar6 * dVar3 +
                 dVar7 * *(double *)
                          ((long)&(g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->y + lVar9));
    std::vector<Point,_std::allocator<Point>_>::emplace_back<Point>(&k.points,&local_48);
    lVar9 = lVar9 + 0x18;
  }
  std::vector<Point,_std::allocator<Point>_>::vector
            ((vector<Point,_std::allocator<Point>_> *)&local_60,&k.points);
  Field::add(&this->f,(Group *)&local_60);
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base(&local_60);
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
            ((_Vector_base<Point,_std::allocator<Point>_> *)&k);
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
            ((_Vector_base<Point,_std::allocator<Point>_> *)&g);
  return;
}

Assistant:

void Functional::turn(int id, double alpha) {
    Group g = f.groups[id];
    Group k;
    double tmpx, tmpy;
    for (int i = 0; i < (int) g.points.size(); i++) {
        tmpx = g.points[i].x * cos(PI * alpha / 180) - sin(PI * alpha / 180) * g.points[i].y;
        tmpy = g.points[i].x * sin(PI * alpha / 180) + cos(PI * alpha / 180) * g.points[i].y;
        k.points.push_back(Point(tmpx, tmpy));

    }
    f.add(k);

}